

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceBindingBase.hpp
# Opt level: O2

void __thiscall
Diligent::ShaderResourceBindingBase<Diligent::EngineVkImplTraits>::ShaderResourceBindingBase
          (ShaderResourceBindingBase<Diligent::EngineVkImplTraits> *this,
          IReferenceCounters *pRefCounters,ResourceSignatureType *pPRS)

{
  array<signed_char,_6UL> *Args_1;
  PIPELINE_TYPE PipelineType;
  char cVar1;
  PipelineResourceSignatureVkImpl *pPVar2;
  SHADER_TYPE SVar3;
  Int32 IVar4;
  ShaderVariableManagerVk *pSVar5;
  IMemoryAllocator *Allocator;
  uint uVar6;
  reference_wrapper<Diligent::ShaderResourceCacheVk> *args_1;
  Uint32 s;
  Uint32 UVar7;
  Uint32 s_1;
  string msg;
  reference_wrapper<Diligent::ShaderResourceCacheVk> local_90;
  FixedLinearAllocator MemPool;
  
  ObjectBase<Diligent::IShaderResourceBindingVk>::ObjectBase
            (&this->super_ObjectBase<Diligent::IShaderResourceBindingVk>,pRefCounters);
  (this->super_ObjectBase<Diligent::IShaderResourceBindingVk>).
  super_RefCountedObject<Diligent::IShaderResourceBindingVk>.super_IShaderResourceBindingVk.
  super_IShaderResourceBinding.super_IObject._vptr_IObject =
       (_func_int **)&PTR_QueryInterface_00897578;
  RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl>::RefCntAutoPtr(&this->m_pPRS,pPRS);
  (this->m_ShaderResourceCache).super_ShaderResourceCacheBase.m_DvpRevision.
  super___atomic_base<unsigned_int>._M_i = 0;
  Args_1 = &this->m_ActiveShaderStageIndex;
  (this->m_ShaderResourceCache).m_pMemory._M_t.
  super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
  super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  super__Tuple_impl<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  super__Head_base<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>,_false>._M_head_impl
       = (STDDeleter<void,_Diligent::IMemoryAllocator>)0x0;
  (this->m_ShaderResourceCache).m_pMemory._M_t.
  super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
  super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  super__Head_base<0UL,_void_*,_false>._M_head_impl = (void *)0x0;
  (this->m_ShaderResourceCache).m_NumSets = 0;
  (this->m_ShaderResourceCache).m_NumDynamicBuffers = 0;
  *(undefined4 *)&(this->m_ShaderResourceCache).field_0x1c = 0x80000000;
  (this->m_ShaderResourceCache).m_DbgInitializedResources.
  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_ShaderResourceCache).m_DbgInitializedResources.
  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_ShaderResourceCache).m_DbgInitializedResources.
  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_pShaderVarMgrs = (ShaderVariableManagerImplType *)0x0;
  this->m_bStaticResourcesInitialized = false;
  (this->m_ActiveShaderStageIndex)._M_elems[0] = -1;
  (this->m_ActiveShaderStageIndex)._M_elems[1] = -1;
  (this->m_ActiveShaderStageIndex)._M_elems[2] = -1;
  (this->m_ActiveShaderStageIndex)._M_elems[3] = -1;
  (this->m_ActiveShaderStageIndex)._M_elems[4] = -1;
  (this->m_ActiveShaderStageIndex)._M_elems[5] = -1;
  pPVar2 = (this->m_pPRS).m_pObject;
  SVar3 = (pPVar2->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).m_ShaderStages
  ;
  uVar6 = SVar3 - (SVar3 >> 1 & 0x55555555);
  uVar6 = (uVar6 >> 2 & 0x33333333) + (uVar6 & 0x33333333);
  uVar6 = ((uVar6 >> 4) + uVar6 & 0xf0f0f0f) * 0x1010101 >> 0x18;
  PipelineType = (pPVar2->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
                 m_PipelineType;
  for (UVar7 = 0; uVar6 != UVar7; UVar7 = UVar7 + 1) {
    SVar3 = PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::GetActiveShaderStageType
                      (&pPRS->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>,
                       UVar7);
    IVar4 = GetShaderTypePipelineIndex(SVar3,PipelineType);
    Args_1->_M_elems[IVar4] = (char)UVar7;
  }
  MemPool.m_pAllocator = GetRawAllocator();
  MemPool.m_ReservedSize = 0;
  MemPool.m_CurrAlignment = 0;
  MemPool.m_pDataStart = (uint8_t *)0x0;
  MemPool.m_pCurrPtr = (uint8_t *)0x0;
  MemPool.m_DbgCurrAllocation = 0;
  MemPool.m_DbgAllocations.
  super__Vector_base<Diligent::FixedLinearAllocator::DbgAllocationInfo,_std::allocator<Diligent::FixedLinearAllocator::DbgAllocationInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  MemPool.m_DbgAllocations.
  super__Vector_base<Diligent::FixedLinearAllocator::DbgAllocationInfo,_std::allocator<Diligent::FixedLinearAllocator::DbgAllocationInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  MemPool.m_DbgAllocations.
  super__Vector_base<Diligent::FixedLinearAllocator::DbgAllocationInfo,_std::allocator<Diligent::FixedLinearAllocator::DbgAllocationInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  MemPool.m_DbgUsingExternalMemory = false;
  FixedLinearAllocator::AddSpace<Diligent::ShaderVariableManagerVk>(&MemPool,(ulong)uVar6);
  FixedLinearAllocator::Reserve(&MemPool);
  args_1 = &local_90;
  msg._M_dataplus._M_p = (pointer)this;
  local_90._M_data = &this->m_ShaderResourceCache;
  pSVar5 = FixedLinearAllocator::
           ConstructArray<Diligent::ShaderVariableManagerVk,std::reference_wrapper<Diligent::ShaderResourceBindingBase<Diligent::EngineVkImplTraits>>,std::reference_wrapper<Diligent::ShaderResourceCacheVk>>
                     (&MemPool,(ulong)uVar6,
                      (reference_wrapper<Diligent::ShaderResourceBindingBase<Diligent::EngineVkImplTraits>_>
                       *)&msg,args_1);
  this->m_pShaderVarMgrs = pSVar5;
  MemPool.m_pAllocator = (IMemoryAllocator *)0x0;
  if ((ShaderVariableManagerVk *)MemPool.m_pDataStart != pSVar5) {
    FormatString<char[26],char[24]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Ptr == m_pShaderVarMgrs",(char (*) [24])args_1);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"ShaderResourceBindingBase",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceBindingBase.hpp"
               ,0x67);
    std::__cxx11::string::~string((string *)&msg);
  }
  PipelineResourceSignatureVkImpl::InitSRBResourceCache(pPRS,&this->m_ShaderResourceCache);
  for (UVar7 = 0; uVar6 != UVar7; UVar7 = UVar7 + 1) {
    SVar3 = PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::GetActiveShaderStageType
                      (&pPRS->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>,
                       UVar7);
    IVar4 = GetShaderTypePipelineIndex
                      (SVar3,(pPRS->
                             super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
                             m_PipelineType);
    cVar1 = Args_1->_M_elems[IVar4];
    if ((cVar1 < '\0') || (uVar6 <= (uint)(int)cVar1)) {
      FormatString<char[26],char[53]>
                (&msg,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"MgrInd >= 0 && MgrInd < static_cast<int>(NumShaders)",
                 Args_1->_M_elems);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"ShaderResourceBindingBase",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceBindingBase.hpp"
                 ,0x75);
      std::__cxx11::string::~string((string *)&msg);
    }
    Allocator = SRBMemoryAllocator::GetShaderVariableDataAllocator
                          (&(pPRS->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>
                            ).m_SRBMemAllocator,UVar7);
    msg._M_dataplus._M_p._0_2_ = 0x201;
    ShaderVariableManagerVk::Initialize
              (this->m_pShaderVarMgrs + (int)cVar1,pPRS,Allocator,
               (SHADER_RESOURCE_VARIABLE_TYPE *)&msg,2,SVar3);
  }
  FixedLinearAllocator::~FixedLinearAllocator(&MemPool);
  return;
}

Assistant:

ShaderResourceBindingBase(IReferenceCounters* pRefCounters, ResourceSignatureType* pPRS) :
        TObjectBase{pRefCounters},
        m_pPRS{pPRS},
        m_ShaderResourceCache{ResourceCacheContentType::SRB}
    {
        try
        {
            m_ActiveShaderStageIndex.fill(-1);

            const Uint32        NumShaders   = GetNumShaders();
            const PIPELINE_TYPE PipelineType = GetPipelineType();
            for (Uint32 s = 0; s < NumShaders; ++s)
            {
                const SHADER_TYPE ShaderType = pPRS->GetActiveShaderStageType(s);
                const Int32       ShaderInd  = GetShaderTypePipelineIndex(ShaderType, PipelineType);

                m_ActiveShaderStageIndex[ShaderInd] = static_cast<Int8>(s);
            }


            FixedLinearAllocator MemPool{GetRawAllocator()};
            MemPool.AddSpace<ShaderVariableManagerImplType>(NumShaders);
            MemPool.Reserve();
            static_assert(std::is_nothrow_constructible<ShaderVariableManagerImplType, decltype(*this), ShaderResourceCacheImplType&>::value,
                          "Constructor of ShaderVariableManagerImplType must be noexcept, so we can safely construct all managers");
            m_pShaderVarMgrs = MemPool.ConstructArray<ShaderVariableManagerImplType>(NumShaders, std::ref(*this), std::ref(m_ShaderResourceCache));

            // The memory is now owned by ShaderResourceBindingBase and will be freed by Destruct().
            void* Ptr = MemPool.ReleaseOwnership();
            VERIFY_EXPR(Ptr == m_pShaderVarMgrs);
            (void)Ptr;

            // It is important to construct all objects before initializing them because if an exception is thrown,
            // Destruct() will call destructors for all non-null objects.

            pPRS->InitSRBResourceCache(m_ShaderResourceCache);

            SRBMemoryAllocator& SRBMemAllocator = pPRS->GetSRBMemoryAllocator();
            for (Uint32 s = 0; s < NumShaders; ++s)
            {
                const SHADER_TYPE ShaderType = pPRS->GetActiveShaderStageType(s);
                const Int32       ShaderInd  = GetShaderTypePipelineIndex(ShaderType, pPRS->GetPipelineType());
                const int         MgrInd     = m_ActiveShaderStageIndex[ShaderInd];
                VERIFY_EXPR(MgrInd >= 0 && MgrInd < static_cast<int>(NumShaders));

                IMemoryAllocator& VarDataAllocator = SRBMemAllocator.GetShaderVariableDataAllocator(s);

                // Initialize vars manager to reference mutable and dynamic variables
                // Note that the cache has space for all variable types
                const SHADER_RESOURCE_VARIABLE_TYPE VarTypes[] = {SHADER_RESOURCE_VARIABLE_TYPE_MUTABLE, SHADER_RESOURCE_VARIABLE_TYPE_DYNAMIC};
                m_pShaderVarMgrs[MgrInd].Initialize(*pPRS, VarDataAllocator, VarTypes, _countof(VarTypes), ShaderType);
            }
        }
        catch (...)
        {
            // We must release objects manually as destructor will not be called.
            Destruct();
            throw;
        }
    }